

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O0

REF_STATUS ref_gather_surf_status_tec(REF_GRID ref_grid,char *filename)

{
  REF_INT node0_00;
  REF_STATUS RVar1;
  uint uVar2;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  double local_128;
  REF_DBL local_120;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i;
  REF_INT ldim;
  char *vars [4];
  REF_DBL edge_ratio;
  REF_EDGE ref_edge;
  REF_INT nodes [27];
  REF_INT cell_node;
  REF_INT node1;
  REF_INT node0;
  REF_INT edge;
  REF_INT cell;
  REF_DBL normdev;
  REF_DBL quality;
  REF_DBL *scalar;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  char *filename_local;
  REF_GRID ref_grid_local;
  
  ref_cell = (REF_CELL)ref_grid->node;
  _ref_malloc_init_i = "q";
  vars[0] = "s";
  vars[1] = "l";
  vars[2] = "n";
  ref_node = (REF_NODE)filename;
  filename_local = (char *)ref_grid;
  if (((REF_NODE)ref_cell)->max * 4 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x1170
           ,"ref_gather_surf_status_tec","malloc scalar of REF_DBL negative");
    ref_grid_local._4_4_ = 1;
  }
  else {
    quality = (REF_DBL)malloc((long)(((REF_NODE)ref_cell)->max * 4) << 3);
    if ((void *)quality == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x1170,"ref_gather_surf_status_tec","malloc scalar of REF_DBL NULL");
      ref_grid_local._4_4_ = 2;
    }
    else {
      for (ref_private_macro_code_rss_1 = 0;
          ref_private_macro_code_rss_1 < ref_cell->last_node_is_an_id * 4;
          ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
        *(undefined8 *)((long)quality + (long)ref_private_macro_code_rss_1 * 8) = 0x3ff0000000000000
        ;
      }
      scalar = *(REF_DBL **)(filename_local + 0x28);
      for (node0 = 0; node0 < *(int *)((long)scalar + 0x2c); node0 = node0 + 1) {
        RVar1 = ref_cell_nodes((REF_CELL)scalar,node0,(REF_INT *)&ref_edge);
        if (RVar1 == 0) {
          uVar2 = ref_node_tri_quality((REF_NODE)ref_cell,(REF_INT *)&ref_edge,&normdev);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x1173,"ref_gather_surf_status_tec",(ulong)uVar2,"tri qual");
            return uVar2;
          }
          _edge = 2.0;
          if (((*(long *)(*(long *)(filename_local + 0x98) + 0x90) != 0) ||
              (*(long *)(*(long *)(filename_local + 0x98) + 0xd8) != 0)) &&
             (uVar2 = ref_geom_tri_norm_deviation
                                ((REF_GRID)filename_local,(REF_INT *)&ref_edge,(REF_DBL *)&edge),
             uVar2 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x1177,"ref_gather_surf_status_tec",(ulong)uVar2,"norm dev");
            return uVar2;
          }
          for (nodes[0x19] = 0; nodes[0x19] < *(int *)((long)scalar + 0xc);
              nodes[0x19] = nodes[0x19] + 1) {
            if (normdev <=
                *(double *)((long)quality + (long)(nodes[(long)nodes[0x19] + -2] * 4) * 8)) {
              local_120 = normdev;
            }
            else {
              local_120 = *(REF_DBL *)
                           ((long)quality + (long)(nodes[(long)nodes[0x19] + -2] * 4) * 8);
            }
            *(REF_DBL *)((long)quality + (long)(nodes[(long)nodes[0x19] + -2] * 4) * 8) = local_120;
            if (_edge <= *(double *)
                          ((long)quality + (long)(nodes[(long)nodes[0x19] + -2] * 4 + 3) * 8)) {
              local_128 = _edge;
            }
            else {
              local_128 = *(double *)
                           ((long)quality + (long)(nodes[(long)nodes[0x19] + -2] * 4 + 3) * 8);
            }
            *(double *)((long)quality + (long)(nodes[(long)nodes[0x19] + -2] * 4 + 3) * 8) =
                 local_128;
          }
        }
      }
      uVar2 = ref_edge_create((REF_EDGE *)&edge_ratio,(REF_GRID)filename_local);
      if (uVar2 == 0) {
        for (node1 = 0; node1 < *(int *)edge_ratio; node1 = node1 + 1) {
          node0_00 = *(REF_INT *)(*(long *)((long)edge_ratio + 8) + (long)(node1 << 1) * 4);
          nodes[0x1a] = *(REF_INT *)(*(long *)((long)edge_ratio + 8) + (long)(node1 * 2 + 1) * 4);
          uVar2 = ref_node_ratio((REF_NODE)ref_cell,node0_00,nodes[0x1a],(REF_DBL *)(vars + 3));
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x1184,"ref_gather_surf_status_tec",(ulong)uVar2,"ratio");
            return uVar2;
          }
          if ((double)vars[3] <= *(double *)((long)quality + (long)(node0_00 * 4 + 1) * 8)) {
            local_130 = vars[3];
          }
          else {
            local_130 = *(char **)((long)quality + (long)(node0_00 * 4 + 1) * 8);
          }
          *(char **)((long)quality + (long)(node0_00 * 4 + 1) * 8) = local_130;
          if ((double)vars[3] <= *(double *)((long)quality + (long)(nodes[0x1a] * 4 + 1) * 8)) {
            local_138 = vars[3];
          }
          else {
            local_138 = *(char **)((long)quality + (long)(nodes[0x1a] * 4 + 1) * 8);
          }
          *(char **)((long)quality + (long)(nodes[0x1a] * 4 + 1) * 8) = local_138;
          if (*(double *)((long)quality + (long)(node0_00 * 4 + 2) * 8) <= (double)vars[3]) {
            local_140 = vars[3];
          }
          else {
            local_140 = *(char **)((long)quality + (long)(node0_00 * 4 + 2) * 8);
          }
          *(char **)((long)quality + (long)(node0_00 * 4 + 2) * 8) = local_140;
          if (*(double *)((long)quality + (long)(nodes[0x1a] * 4 + 2) * 8) <= (double)vars[3]) {
            local_148 = vars[3];
          }
          else {
            local_148 = *(char **)((long)quality + (long)(nodes[0x1a] * 4 + 2) * 8);
          }
          *(char **)((long)quality + (long)(nodes[0x1a] * 4 + 2) * 8) = local_148;
        }
        uVar2 = ref_edge_free((REF_EDGE)edge_ratio);
        if (uVar2 == 0) {
          uVar2 = ref_gather_scalar_surf_tec
                            ((REF_GRID)filename_local,4,(REF_DBL *)quality,
                             (char **)&ref_malloc_init_i,(char *)ref_node);
          if (uVar2 == 0) {
            if (quality != 0.0) {
              free((void *)quality);
            }
            ref_grid_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x118d,"ref_gather_surf_status_tec",(ulong)uVar2,"dump");
            ref_grid_local._4_4_ = uVar2;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x118a,"ref_gather_surf_status_tec",(ulong)uVar2,"free edges");
          ref_grid_local._4_4_ = uVar2;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x1180,"ref_gather_surf_status_tec",(ulong)uVar2,"create edges");
        ref_grid_local._4_4_ = uVar2;
      }
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_gather_surf_status_tec(REF_GRID ref_grid,
                                              const char *filename) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_DBL *scalar, quality, normdev;
  REF_INT cell, edge, node0, node1, cell_node, nodes[REF_CELL_MAX_SIZE_PER];
  REF_EDGE ref_edge;
  REF_DBL edge_ratio;
  const char *vars[4];
  REF_INT ldim = 4;

  vars[0] = "q";
  vars[1] = "s";
  vars[2] = "l";
  vars[3] = "n";
  ref_malloc_init(scalar, ldim * ref_node_max(ref_node), REF_DBL, 1.0);
  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_node_tri_quality(ref_node, nodes, &quality), "tri qual");
    normdev = 2.0;
    if (ref_geom_model_loaded(ref_grid_geom(ref_grid)) ||
        ref_geom_meshlinked(ref_grid_geom(ref_grid))) {
      RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev), "norm dev");
    }
    each_ref_cell_cell_node(ref_cell, cell_node) {
      scalar[0 + ldim * nodes[cell_node]] =
          MIN(scalar[0 + ldim * nodes[cell_node]], quality);
      scalar[3 + ldim * nodes[cell_node]] =
          MIN(scalar[3 + ldim * nodes[cell_node]], normdev);
    }
  }
  RSS(ref_edge_create(&ref_edge, ref_grid), "create edges");
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    RSS(ref_node_ratio(ref_node, node0, node1, &edge_ratio), "ratio");
    scalar[1 + ldim * node0] = MIN(scalar[1 + ldim * node0], edge_ratio);
    scalar[1 + ldim * node1] = MIN(scalar[1 + ldim * node1], edge_ratio);
    scalar[2 + ldim * node0] = MAX(scalar[2 + ldim * node0], edge_ratio);
    scalar[2 + ldim * node1] = MAX(scalar[2 + ldim * node1], edge_ratio);
  }
  RSS(ref_edge_free(ref_edge), "free edges");

  RSS(ref_gather_scalar_surf_tec(ref_grid, ldim, scalar, vars, filename),
      "dump");

  ref_free(scalar);

  return REF_SUCCESS;
}